

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

RectInfo * __thiscall
ImPlot::GetterHeatmap<long_long>::operator()
          (RectInfo *__return_storage_ptr__,GetterHeatmap<long_long> *this,int idx)

{
  long lVar1;
  ImPlotPoint IVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImU32 IVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  
  lVar1 = this->Values[idx];
  dVar4 = (this->HalfSize).x;
  dVar5 = (this->HalfSize).y;
  dVar9 = this->XRef + dVar4 + this->Width * (double)(idx % this->Cols);
  dVar10 = this->YRef + this->YDir * ((double)(idx / this->Cols) * this->Height + dVar5);
  dVar3 = dVar10 - dVar5;
  IVar2.y._0_4_ = SUB84(dVar3,0);
  IVar2.x = dVar9 - dVar4;
  IVar2.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
  __return_storage_ptr__->Min = IVar2;
  (__return_storage_ptr__->Max).x = dVar9 + dVar4;
  (__return_storage_ptr__->Max).y = dVar10 + dVar5;
  fVar7 = (float)(((double)lVar1 - this->ScaleMin) / (this->ScaleMax - this->ScaleMin));
  fVar8 = 1.0;
  if (fVar7 <= 1.0) {
    fVar8 = fVar7;
  }
  IVar6 = ImPlotColormapData::LerpTable
                    (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                     (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8));
  __return_storage_ptr__->Color = IVar6;
  return __return_storage_ptr__;
}

Assistant:

inline RectInfo operator()(int idx) const {
        double val = (double)Values[idx];
        const int r = idx / Cols;
        const int c = idx % Cols;
        const ImPlotPoint p(XRef + HalfSize.x + c*Width, YRef + YDir * (HalfSize.y + r*Height));
        RectInfo rect;
        rect.Min.x = p.x - HalfSize.x;
        rect.Min.y = p.y - HalfSize.y;
        rect.Max.x = p.x + HalfSize.x;
        rect.Max.y = p.y + HalfSize.y;
        const float t = ImClamp((float)ImRemap01(val, ScaleMin, ScaleMax),0.0f,1.0f);
        rect.Color = GImPlot->ColormapData.LerpTable(GImPlot->Style.Colormap, t);
        return rect;
    }